

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

void __thiscall
CTextRender::TextDeferred(CTextRender *this,CTextCursor *pCursor,char *pText,int Length)

{
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this_00;
  float fVar1;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar2;
  uint uVar3;
  int iVar4;
  IGraphics *pIVar5;
  CScaledGlyph *pCVar6;
  bool bVar7;
  vec2 ScreenScale;
  vec2 ScreenScale_00;
  float fVar8;
  uint i;
  long lVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int NumDots;
  uint uVar16;
  uint uVar17;
  byte *pText_00;
  long in_FS_OFFSET;
  uint uVar18;
  float fVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar21;
  float fVar22;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar23;
  float fVar24;
  CWordWidthHint CVar25;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  char aEllipsis [4];
  int local_70;
  float local_4c;
  undefined1 local_48 [4];
  float local_44;
  undefined1 local_40 [4];
  char local_3c [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pCursor->m_Truncated == false) && (pCursor->m_SkipTextRender == false)) &&
     (this->m_pGlyphMap->m_DefaultFace != (FT_Face_conflict)0x0)) {
    uVar17 = pCursor->m_Flags;
    pIVar5 = this->m_pGraphics;
    iVar13 = pIVar5->m_ScreenHeight;
    (*(pIVar5->super_IInterface)._vptr_IInterface[6])(pIVar5,local_40,&local_44,local_48,&local_4c);
    aVar23.x = (float)iVar13 / (local_4c - local_44);
    fVar22 = pCursor->m_FontSize * aVar23.x;
    iVar13 = (int)fVar22;
    fVar22 = (float)(int)fVar22 / aVar23.x;
    piVar11 = s_aFontSizes;
    lVar9 = 0;
    do {
      if (iVar13 <= *piVar11) goto LAB_001325de;
      lVar9 = lVar9 + 1;
      piVar11 = piVar11 + 1;
    } while (lVar9 != 0x10);
    lVar9 = 0x10;
LAB_001325de:
    uVar16 = 0xf;
    if ((uint)lVar9 < 0xf) {
      uVar16 = (uint)lVar9;
    }
    uVar3 = pCursor->m_Flags;
    uVar18 = -(uint)(pCursor->m_MaxWidth < 0.0);
    fVar8 = (float)(~uVar18 & (uint)pCursor->m_MaxWidth | uVar18 & 0x7f800000);
    iVar10 = (int)((local_4c - local_44) / pCursor->m_FontSize);
    if (-1 < pCursor->m_MaxLines) {
      iVar10 = pCursor->m_MaxLines;
    }
    if (Length < 0) {
      Length = str_length(pText);
    }
    aVar21.y = 0.0;
    fVar19 = (float)(int)(((pCursor->m_Advance).field_1.y + pCursor->m_FontSize) * aVar23.x) /
             aVar23.x;
    if (fVar19 <= pCursor->m_NextLineAdvanceY) {
      fVar19 = pCursor->m_NextLineAdvanceY;
    }
    pCursor->m_NextLineAdvanceY = fVar19;
    this_00 = &pCursor->m_Glyphs;
    pText_00 = (byte *)pText;
    aVar20.x = aVar23.x;
    do {
      if ((pText + Length <= pText_00) || (pCursor->m_Truncated != false)) break;
      fVar19 = (pCursor->m_Advance).field_0.x;
      ScreenScale.field_1.y = aVar21.y;
      ScreenScale.field_0.x = aVar20.x;
      CVar25 = MakeWord(this,pCursor,(char *)pText_00,pText + Length,uVar16,fVar22,iVar13,
                        ScreenScale);
      uVar14 = CVar25._0_8_;
      pCursor->m_StartOfLine = false;
      if (-1 < (long)uVar14) {
        if (fVar8 < CVar25.m_EffectiveAdvanceX) {
          iVar4 = (pCursor->m_Glyphs).num_elements;
          lVar9 = (long)iVar4;
          iVar15 = CVar25.m_GlyphCount;
          if (((iVar15 == 1) && ((ulong)*pText_00 < 0x21)) &&
             ((0x100000600U >> ((ulong)*pText_00 & 0x3f) & 1) != 0)) {
            if ((uVar17 & 1) == 0) {
              array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                        (this_00,iVar4 + -1);
            }
            (pCursor->m_Advance).field_0.x = fVar19;
          }
          else if (pCursor->m_LineCount < iVar10) {
            pCursor->m_LineCount = pCursor->m_LineCount + 1;
            fVar1 = (pCursor->m_Advance).field_1.y;
            aVar2 = (anon_union_4_2_94730284_for_vector2_base<float>_1)pCursor->m_NextLineAdvanceY;
            fVar24 = pCursor->m_LineSpacing + aVar2.x;
            (pCursor->m_Advance).field_1.y = fVar24;
            (pCursor->m_Advance).field_0.x = (pCursor->m_Advance).field_0.x - fVar19;
            aVar20.x = (float)(int)((fVar24 + pCursor->m_FontSize) * aVar23.x) / aVar23.x;
            if (aVar20.x <= aVar2.x) {
              aVar20 = aVar2;
            }
            pCursor->m_NextLineAdvanceY = (float)aVar20;
            if (((uVar17 & 1) == 0) && (0 < iVar15)) {
              lVar12 = lVar9 << 6;
              do {
                pCVar6 = (pCursor->m_Glyphs).list;
                *(float *)((long)pCVar6 + lVar12 + -0x2c) =
                     *(float *)((long)pCVar6 + lVar12 + -0x2c) - fVar19;
                pCVar6 = (pCursor->m_Glyphs).list;
                aVar20.x = ((pCursor->m_Advance).field_1.y - fVar1) +
                           *(float *)((long)pCVar6 + lVar12 + -0x28);
                lVar9 = lVar9 + -1;
                ((anon_union_4_2_94730284_for_vector2_base<float>_1 *)
                ((long)pCVar6 + lVar12 + -0x28))->x = (float)aVar20;
                *(int *)((long)(pCursor->m_Glyphs).list + lVar12 + -0x30) =
                     pCursor->m_LineCount + -1;
                lVar12 = lVar12 + -0x40;
              } while (iVar4 - iVar15 < lVar9);
            }
            aVar21.y = 0.0;
            pCursor->m_StartOfLine = false;
          }
          else {
            pCursor->m_Truncated = true;
          }
        }
        fVar19 = (pCursor->m_Advance).field_0.x;
        if (fVar19 <= pCursor->m_Width) {
          fVar19 = pCursor->m_Width;
        }
        pCursor->m_Width = fVar19;
        if ((CVar25._8_8_ >> 0x20 & 1) != 0 && (uVar3 & 2) != 0 || (CVar25._8_8_ >> 0x28 & 1) != 0)
        {
          if (pCursor->m_LineCount < iVar10) {
            pCursor->m_LineCount = pCursor->m_LineCount + 1;
            aVar2 = (anon_union_4_2_94730284_for_vector2_base<float>_1)pCursor->m_NextLineAdvanceY;
            fVar19 = pCursor->m_LineSpacing + aVar2.x;
            (pCursor->m_Advance).field_1.y = fVar19;
            (pCursor->m_Advance).field_0.x = 0.0;
            pCursor->m_StartOfLine = true;
            aVar21.y = 0.0;
            aVar20.x = (float)(int)((fVar19 + pCursor->m_FontSize) * aVar23.x) / aVar23.x;
            if (aVar20.x <= aVar2.x) {
              aVar20 = aVar2;
            }
            pCursor->m_NextLineAdvanceY = (float)aVar20;
          }
          else {
            pCursor->m_Truncated = true;
          }
        }
        pText_00 = pText_00 + (uVar14 >> 0x20);
      }
    } while (-1 < (long)uVar14);
    pCursor->m_Height = fVar22 * 0.35 + pCursor->m_NextLineAdvanceY;
    local_70 = (int)pText;
    pCursor->m_CharCount = (int)pText_00 - local_70;
    if ((pCursor->m_Truncated == true) && ((pCursor->m_Flags & 4) != 0)) {
      builtin_strncpy(local_3c,"…",4);
      lVar9 = (long)(pCursor->m_Glyphs).num_elements;
      if (0 < lVar9) {
        pCVar6 = (pCursor->m_Glyphs).list;
        (pCursor->m_Advance).field_0.x =
             (pCVar6[lVar9 + -1].m_pGlyph)->m_AdvanceX * pCVar6[lVar9 + -1].m_Size +
             pCVar6[lVar9 + -1].m_Advance.field_0.x;
        (pCursor->m_Advance).field_1 = pCVar6[lVar9 + -1].m_Advance.field_1;
      }
      fVar19 = pCursor->m_MaxWidth;
      pCursor->m_MaxWidth = -1.0;
      ScreenScale_00.field_1.y = aVar21.y;
      ScreenScale_00.field_0.x = aVar20.x;
      CVar25 = MakeWord(this,pCursor,local_3c,(char *)&local_38,uVar16,fVar22,iVar13,ScreenScale_00)
      ;
      pCursor->m_MaxWidth = (float)(int)fVar19;
      if (fVar8 < CVar25.m_EffectiveAdvanceX) {
        uVar16 = CVar25.m_GlyphCount;
        uVar17 = ~uVar16 + (pCursor->m_Glyphs).num_elements;
        fVar22 = 0.0;
        if (1 < (int)uVar17) {
          uVar14 = (ulong)uVar17 << 6 | 0x14;
          do {
            pCVar6 = this_00->list;
            fVar19 = *(float *)((long)&pCVar6->m_pGlyph + uVar14);
            if (*(float *)(*(long *)((long)pCVar6 + (uVar14 - 0x14)) + 0x2c) *
                *(float *)((long)pCVar6 + (uVar14 - 0xc)) + fVar19 <= fVar8) break;
            fVar22 = (pCursor->m_Advance).field_0.x - fVar19;
            pCursor->m_CharCount = pCursor->m_CharCount - *(int *)((long)pCVar6 + (uVar14 - 8));
            array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index(this_00,uVar17);
            uVar14 = uVar14 - 0x40;
            bVar7 = 2 < (int)uVar17;
            uVar17 = uVar17 - 1;
          } while (bVar7);
        }
        if (0 < (int)uVar16) {
          lVar9 = (long)(int)((pCursor->m_Glyphs).num_elements - uVar16);
          uVar14 = lVar9 << 6 | 0x14;
          do {
            pCVar6 = (pCursor->m_Glyphs).list;
            *(float *)((long)&pCVar6->m_pGlyph + uVar14) =
                 *(float *)((long)&pCVar6->m_pGlyph + uVar14) - fVar22;
            lVar9 = lVar9 + 1;
            uVar14 = uVar14 + 0x40;
          } while (lVar9 < (pCursor->m_Glyphs).num_elements);
        }
      }
    }
    TextRefreshGlyphs(this,pCursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTextRender::TextDeferred(CTextCursor *pCursor, const char *pText, int Length)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	if(!m_pGlyphMap->GetDefaultFace())
		return;

	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;
	int FontSizeIndex = m_pGlyphMap->GetFontSizeIndex(PixelSize);

	// Cursor current states
	int Flags = pCursor->m_Flags;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(Length < 0)
		Length = str_length(pText);

	const char *pCur = (char *)pText;
	const char *pEnd = (char *)pText + Length;

	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

	while(pCur < pEnd && !pCursor->m_Truncated)
	{
		const float WordStartAdvanceX = pCursor->m_Advance.x;
		CWordWidthHint WordWidth = MakeWord(pCursor, pCur, pEnd, FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_StartOfLine = false;
		if(WordWidth.m_CharCount < 0)
			break;
		
		// word wrapping
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			const int NumGlyphs = pCursor->m_Glyphs.size();
			// do not let space create new line.
			if(WordWidth.m_GlyphCount == 1 && (*pCur == ' ' || *pCur == '\n' || *pCur == '\t'))
			{
				if(Render)
					pCursor->m_Glyphs.remove_index(NumGlyphs-1);
				pCursor->m_Advance.x = WordStartAdvanceX;
			}
			else
			{
				if(pCursor->m_LineCount < MaxLines)
				{
					pCursor->m_LineCount++;
					float AdvanceY = pCursor->m_Advance.y;
					pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
					pCursor->m_Advance.x -= WordStartAdvanceX;

					float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
					NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
					pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

					if(Render)
					{
						const int WordStartGlyphIndex = NumGlyphs - WordWidth.m_GlyphCount;
						for(int i = NumGlyphs - 1; i >= WordStartGlyphIndex; --i)
						{
							pCursor->m_Glyphs[i].m_Advance.x -= WordStartAdvanceX;
							pCursor->m_Glyphs[i].m_Advance.y += pCursor->m_Advance.y - AdvanceY;
							pCursor->m_Glyphs[i].m_Line = pCursor->m_LineCount - 1;
						}
					}

					pCursor->m_StartOfLine = false;
				}
				else
				{
					pCursor->m_Truncated = true;
				}
			}
		}

		pCursor->m_Width = maximum(pCursor->m_Advance.x, pCursor->m_Width);

		// newline \n
		bool ForceNewLine = WordWidth.m_EndsWithNewline && (Flags & TEXTFLAG_ALLOW_NEWLINE);
		if(ForceNewLine || WordWidth.m_IsBroken)
		{
			if(pCursor->m_LineCount < MaxLines)
			{
				pCursor->m_LineCount++;
				pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
				pCursor->m_Advance.x = 0;
				pCursor->m_StartOfLine = true;

				float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
				NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
				pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);
			}
			else
			{
				pCursor->m_Truncated = true;
			}
		}

		pCur += WordWidth.m_CharCount;
	}

	pCursor->m_Height = pCursor->m_NextLineAdvanceY + 0.35f * Size;
	pCursor->m_CharCount = pCur - pText;

	// insert ellipsis at the end
	if(pCursor->m_Truncated && pCursor->m_Flags & TEXTFLAG_ELLIPSIS)
	{
		const char aEllipsis[] = "…";
		if(pCursor->m_Glyphs.size() > 0)
		{
			CScaledGlyph *pLastGlyph = &pCursor->m_Glyphs[pCursor->m_Glyphs.size()-1];
			pCursor->m_Advance.x = pLastGlyph->m_Advance.x + pLastGlyph->m_pGlyph->m_AdvanceX * pLastGlyph->m_Size;
			pCursor->m_Advance.y = pLastGlyph->m_Advance.y;
		}

		int OldMaxWidth = pCursor->m_MaxWidth;
		pCursor->m_MaxWidth = -1;
		CWordWidthHint WordWidth = MakeWord(pCursor, aEllipsis, aEllipsis+sizeof(aEllipsis), FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_MaxWidth = OldMaxWidth;
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			int NumDots = WordWidth.m_GlyphCount;
			int NumGlyphs = pCursor->m_Glyphs.size() - NumDots;
			float BackAdvanceX = 0;
			for(int i = NumGlyphs - 1; i > 1; --i)
			{
				CScaledGlyph *pScaled = &pCursor->m_Glyphs[i];
				if(pScaled->m_Advance.x + pScaled->m_pGlyph->m_AdvanceX * pScaled->m_Size > MaxWidth)
				{
					BackAdvanceX = pCursor->m_Advance.x - pScaled->m_Advance.x;
					pCursor->m_CharCount -= pScaled->m_NumChars;
					pCursor->m_Glyphs.remove_index(i);
				}
				else
					break;
			}
			for(int i = pCursor->m_Glyphs.size() - NumDots; i < pCursor->m_Glyphs.size(); ++i)
				pCursor->m_Glyphs[i].m_Advance.x -= BackAdvanceX;
		}
	}

	TextRefreshGlyphs(pCursor);
}